

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

IterateResult __thiscall VertexAttrib64Bit::LimitTest::iterate(LimitTest *this)

{
  bool bVar1;
  IterateResult IVar2;
  bool local_11;
  bool result;
  LimitTest *this_local;
  
  Base::IterateStart(&this->super_Base);
  Base::RequireExtension(&this->super_Base,"GL_ARB_vertex_attrib_64bit");
  testInit(this);
  local_11 = testIteration(this,DOUBLE_DVEC2);
  bVar1 = testIteration(this,DVEC3_DVEC4);
  if (!bVar1) {
    local_11 = false;
  }
  bVar1 = testIteration(this,DMAT2);
  if (!bVar1) {
    local_11 = false;
  }
  bVar1 = testIteration(this,DMAT3X2_DMAT4X2);
  if (!bVar1) {
    local_11 = false;
  }
  bVar1 = testIteration(this,DMAT2X3_DMAT2X4);
  if (!bVar1) {
    local_11 = false;
  }
  bVar1 = testIteration(this,DMAT3_DMAT3X4);
  if (!bVar1) {
    local_11 = false;
  }
  bVar1 = testIteration(this,DMAT4X3_DMAT4);
  if (!bVar1) {
    local_11 = false;
  }
  IVar2 = Base::IterateStop(&this->super_Base,local_11);
  return IVar2;
}

Assistant:

tcu::TestNode::IterateResult LimitTest::iterate()
{
	IterateStart();

	bool result = true;

	RequireExtension("GL_ARB_vertex_attrib_64bit");

	testInit();

	if (false == testIteration(DOUBLE_DVEC2))
	{
		result = false;
	}

	if (false == testIteration(DVEC3_DVEC4))
	{
		result = false;
	}

	if (false == testIteration(DMAT2))
	{
		result = false;
	}

	if (false == testIteration(DMAT3X2_DMAT4X2))
	{
		result = false;
	}

	if (false == testIteration(DMAT2X3_DMAT2X4))
	{
		result = false;
	}

	if (false == testIteration(DMAT3_DMAT3X4))
	{
		result = false;
	}

	if (false == testIteration(DMAT4X3_DMAT4))
	{
		result = false;
	}

	/* Done */
	return IterateStop(result);
}